

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  ZSTD_format_e format;
  ulong len;
  XXH64_hash_t XVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ZSTD_DCtx *pZVar6;
  ZSTD_DCtx *__n;
  xxh_u64 xVar7;
  uint *src_00;
  uint *puVar8;
  ZSTD_DCtx *pZVar9;
  uint *puVar10;
  char cVar11;
  ZSTD_DCtx *unaff_RBX;
  ZSTD_DCtx *pZVar12;
  ZSTD_DCtx *pZVar13;
  long lVar14;
  byte bVar15;
  uint *puVar16;
  uint *__dest;
  uint uVar17;
  int iVar18;
  ZSTD_DCtx *__n_00;
  ZSTD_DCtx *pZVar20;
  bool bVar21;
  uint *local_90;
  uint local_64;
  void *local_50;
  ZSTD_DCtx *pZVar19;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9f73,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  local_50 = dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_50 = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  bVar15 = 0;
  local_90 = (uint *)dst;
  do {
    if (ZSTD_f_zstd1_magicless < dctx->format) {
      __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9c36,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
    }
    do {
      if (srcSize < (ZSTD_DCtx *)((ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1)) {
        if ((ZSTD_DCtx *)srcSize != (ZSTD_DCtx *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)local_90 - (long)dst;
      }
      src_00 = (uint *)src;
      pZVar9 = unaff_RBX;
      pZVar12 = (ZSTD_DCtx *)srcSize;
      if (srcSize < (ZSTD_DCtx *)0x4) goto LAB_0017f4e8;
      iVar18 = 0;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        pZVar9 = (ZSTD_DCtx *)0xffffffffffffffb8;
        if ((ZSTD_DCtx *)0x7 < srcSize) {
          pZVar9 = (ZSTD_DCtx *)0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (pZVar9 = (ZSTD_DCtx *)((ulong)*(uint *)((long)src + 4) + 8), srcSize < pZVar9)) {
            pZVar9 = (ZSTD_DCtx *)0xffffffffffffffb8;
          }
        }
        iVar18 = 1;
        if (pZVar9 < (ZSTD_DCtx *)0xffffffffffffff89) {
          bVar21 = srcSize < pZVar9;
          srcSize = srcSize - (long)pZVar9;
          if (bVar21) {
            __assert_fail("skippableSize <= srcSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x9f99,
                          "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                         );
          }
          src = (void *)((long)src + (long)pZVar9);
          iVar18 = 2;
          pZVar9 = unaff_RBX;
        }
      }
      unaff_RBX = pZVar9;
    } while (iVar18 == 2);
    src_00 = (uint *)src;
    pZVar12 = (ZSTD_DCtx *)srcSize;
    if (iVar18 != 0) {
      return (size_t)pZVar9;
    }
LAB_0017f4e8:
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar5 = ZSTD_decompressBegin_usingDict(dctx,local_50,dictSize);
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    puVar16 = (uint *)dctx->previousDstEnd;
    if ((ZSTD_DCtx *)dstCapacity != (ZSTD_DCtx *)0x0 && puVar16 != local_90) {
      dctx->dictEnd = puVar16;
      dctx->virtualStart = (byte *)(((long)dctx->prefixStart - (long)puVar16) + (long)local_90);
      dctx->prefixStart = local_90;
      dctx->previousDstEnd = local_90;
    }
    format = dctx->format;
    src = src_00;
    srcSize = (size_t)pZVar12;
    if (pZVar12 < (ZSTD_DCtx *)((ulong)(format == ZSTD_f_zstd1) * 4 + 5)) {
      unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb8;
    }
    else {
      pZVar6 = (ZSTD_DCtx *)
               ZSTD_frameHeaderSize_internal(src_00,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
      unaff_RBX = pZVar6;
      pZVar13 = pZVar12;
      puVar16 = src_00;
      if (pZVar6 < (ZSTD_DCtx *)0xffffffffffffff89) {
        if (pZVar12 < (ZSTD_DCtx *)((long)&pZVar6->LLTptr + 3U)) {
          unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb8;
          bVar21 = false;
        }
        else {
          unaff_RBX = (ZSTD_DCtx *)ZSTD_decodeFrameHeader(dctx,src_00,(size_t)pZVar6);
          if ((ZSTD_DCtx *)0xffffffffffffff88 < unaff_RBX) goto LAB_0017f661;
          bVar21 = true;
          pZVar13 = (ZSTD_DCtx *)((long)pZVar12 - (long)pZVar6);
          puVar16 = (uint *)((long)src_00 + (long)pZVar6);
        }
      }
      else {
LAB_0017f661:
        bVar21 = false;
      }
      if (bVar21) {
        puVar8 = (uint *)((long)local_90 + dstCapacity);
        pZVar6 = unaff_RBX;
        __dest = local_90;
        pZVar19 = dctx;
        pZVar20 = (ZSTD_DCtx *)dstCapacity;
        do {
          __n_00 = (ZSTD_DCtx *)0xffffffffffffffb8;
          if ((ZSTD_DCtx *)0x2 < pZVar13) {
            pZVar20 = (ZSTD_DCtx *)(ulong)(uint3)((uint3)*puVar16 >> 3);
            local_64 = (ushort)*puVar16 & 1;
            uVar17 = (ushort)((ushort)*puVar16 >> 1) & 3;
            pZVar19 = (ZSTD_DCtx *)(ulong)uVar17;
            __n_00 = pZVar19;
            if ((uVar17 != 1) && (__n_00 = pZVar20, uVar17 == 3)) {
              __n_00 = (ZSTD_DCtx *)0xffffffffffffffec;
            }
          }
          cVar11 = '\x01';
          unaff_RBX = __n_00;
          if (__n_00 < (ZSTD_DCtx *)0xffffffffffffff89) {
            puVar16 = (uint *)((long)puVar16 + 3);
            pZVar13 = (ZSTD_DCtx *)((long)&pZVar13[-1].oversizedDuration + 5);
            if (pZVar13 < __n_00) {
              unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb8;
            }
            else {
              puVar10 = puVar8;
              if (puVar16 < puVar8) {
                puVar10 = puVar16;
              }
              if (puVar16 < __dest) {
                puVar10 = puVar8;
              }
              iVar18 = (int)pZVar19;
              if (iVar18 == 0) {
                unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffba;
                if (__n_00 <= (ZSTD_DCtx *)((long)puVar8 - (long)__dest)) {
                  if (__dest == (uint *)0x0) {
                    unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb6;
                    if (__n_00 == (ZSTD_DCtx *)0x0) {
                      unaff_RBX = __n_00;
                    }
                  }
                  else {
                    memmove(__dest,puVar16,(size_t)__n_00);
                    unaff_RBX = __n_00;
                  }
                }
              }
              else if (iVar18 == 1) {
                __n = (ZSTD_DCtx *)((ulong)pZVar20 & 0xffffffff);
                unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffba;
                if (__n <= (ZSTD_DCtx *)((long)puVar10 - (long)__dest)) {
                  if (__dest == (uint *)0x0) {
                    unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb6;
                    if ((int)pZVar20 == 0) {
                      unaff_RBX = (ZSTD_DCtx *)0x0;
                    }
                  }
                  else {
                    memset(__dest,(uint)*(byte *)puVar16,(size_t)__n);
                    unaff_RBX = __n;
                  }
                }
              }
              else {
                if (iVar18 != 2) {
                  unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffec;
                  goto LAB_0017f70a;
                }
                unaff_RBX = (ZSTD_DCtx *)
                            ZSTD_decompressBlock_internal
                                      (dctx,__dest,(long)puVar10 - (long)__dest,puVar16,
                                       (size_t)__n_00,1,not_streaming);
              }
              if (unaff_RBX < (ZSTD_DCtx *)0xffffffffffffff89) {
                if (dctx->validateChecksum != 0) {
                  XXH_INLINE_XXH64_update(&dctx->xxhState,__dest,(size_t)unaff_RBX);
                }
                __dest = (uint *)((long)__dest + (long)unaff_RBX);
                puVar16 = (uint *)((long)puVar16 + (long)__n_00);
                cVar11 = (local_64 != 0) * '\x05';
                pZVar13 = (ZSTD_DCtx *)((long)pZVar13 - (long)__n_00);
                unaff_RBX = pZVar6;
              }
            }
          }
LAB_0017f70a:
          pZVar6 = unaff_RBX;
        } while (cVar11 == '\0');
        if (cVar11 == '\x05') {
          pZVar6 = (ZSTD_DCtx *)(dctx->fParams).frameContentSize;
          unaff_RBX = (ZSTD_DCtx *)((long)__dest - (long)local_90);
          if ((pZVar6 == (ZSTD_DCtx *)0xffffffffffffffff) || (unaff_RBX == pZVar6)) {
            src = puVar16;
            srcSize = (size_t)pZVar13;
            if ((dctx->fParams).checksumFlag != 0) {
              if (pZVar13 < (ZSTD_DCtx *)0x4) {
                unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffea;
                src = src_00;
                srcSize = (size_t)pZVar12;
              }
              else {
                if (dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum) {
                  len = (dctx->xxhState).total_len;
                  if (len < 0x20) {
                    lVar14 = (dctx->xxhState).v[2] + 0x27d4eb2f165667c5;
                    puVar8 = src_00;
                  }
                  else {
                    XVar1 = (dctx->xxhState).v[0];
                    uVar2 = (dctx->xxhState).v[1];
                    uVar3 = (dctx->xxhState).v[2];
                    uVar4 = (dctx->xxhState).v[3];
                    puVar8 = (uint *)(((uVar2 * -0x6c158a5880000000 |
                                       uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) * -0x61c8864e7a143579 ^
                                      ((XVar1 * -0x6c158a5880000000 |
                                       XVar1 * -0x3d4d51c2d82b14b1 >> 0x21) * -0x61c8864e7a143579 ^
                                      (uVar4 << 0x12 | uVar4 >> 0x2e) +
                                      (uVar3 << 0xc | uVar3 >> 0x34) +
                                      (uVar2 << 7 | uVar2 >> 0x39) +
                                      (XVar1 << 1 | (ulong)((long)XVar1 < 0))) * -0x61c8864e7a143579
                                      + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                                     -0x7a1435883d4d519d);
                    lVar14 = ((uVar4 * -0x6c158a5880000000 | uVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
                              -0x61c8864e7a143579 ^
                             ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
                              -0x61c8864e7a143579 ^ (ulong)puVar8) * -0x61c8864e7a143579 +
                             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
                  }
                  xVar7 = XXH64_finalize(lVar14 + len,(xxh_u8 *)(dctx->xxhState).mem64,len,
                                         (XXH_alignment)puVar8);
                  if (*puVar16 != (uint)xVar7) {
                    unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffea;
                    src = src_00;
                    srcSize = (size_t)pZVar12;
                    goto LAB_0017f97b;
                  }
                }
                src = puVar16 + 1;
                srcSize = (long)&pZVar13[-1].oversizedDuration + 4;
              }
            }
          }
          else {
            unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffec;
          }
        }
      }
    }
LAB_0017f97b:
    if ((bool)(((int)unaff_RBX == -10 && (ZSTD_DCtx *)0xffffffffffffff88 < unaff_RBX) & bVar15)) {
      bVar21 = false;
      unaff_RBX = (ZSTD_DCtx *)0xffffffffffffffb8;
    }
    else if (unaff_RBX < (ZSTD_DCtx *)0xffffffffffffff89) {
      bVar21 = dstCapacity < unaff_RBX;
      dstCapacity = dstCapacity - (long)unaff_RBX;
      if (bVar21) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9fb8,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_90 = (uint *)((long)local_90 + (long)unaff_RBX);
      bVar21 = true;
      unaff_RBX = pZVar9;
    }
    else {
      bVar21 = false;
    }
    bVar15 = 1;
    if (!bVar21) {
      return (size_t)unaff_RBX;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}